

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalValueDatabase.cpp
# Opt level: O1

void __thiscall OptimalValueDatabase::Save(OptimalValueDatabase *this)

{
  ostream *poVar1;
  undefined8 *puVar2;
  stringstream ss;
  ofstream fp;
  long local_3c0;
  long local_3b8;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390 [23];
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(this->_filename)._M_dataplus._M_p,_S_out);
  if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 5) == 0) {
    *(undefined8 *)(local_210 + *(long *)(local_218 + -0x18)) = 0x10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_218,"problem discount horizon value",0x1e);
    std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
    std::ostream::put((char)&local_218);
    std::ostream::flush();
    SoftPrint_abi_cxx11_((string *)local_3a0,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_218,(char *)local_3a0._0_8_,local_3a0._8_8_);
    if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
      operator_delete((void *)local_3a0._0_8_,local_390[0]._M_allocated_capacity + 1);
    }
    local_218 = _VTT;
    *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
    std::filebuf::~filebuf(local_210);
    std::ios_base::~ios_base(local_120);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_3a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_3a0 + 0x10),"OptimalValueDatabase::Save() failed to open file ",0x31)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_3a0 + 0x10),(this->_filename)._M_dataplus._M_p,
                      (this->_filename)._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar1);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar2 = &PTR__E_0059bd80;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_3c0,local_3b8 + local_3c0);
  __cxa_throw(puVar2,&E::typeinfo,E::~E);
}

Assistant:

void OptimalValueDatabase::Save() const
{
    ofstream fp(_filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "OptimalValueDatabase::Save() failed to open file "
           << _filename << endl;
        throw E(ss.str());
    }

    fp.precision(16);
    
    fp << "problem discount horizon value" << endl;
    fp << SoftPrint();
}